

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml.c
# Opt level: O0

void ggml_graph_print(ggml_cgraph *cgraph)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  undefined4 uVar4;
  long lVar5;
  char *pcVar6;
  long lVar7;
  long lVar8;
  int64_t iVar9;
  int64_t iVar10;
  uint *in_RDI;
  int i_2;
  ggml_tensor *node_1;
  int i_1;
  ggml_tensor *node;
  int i;
  int64_t perf_total_per_op_us [35];
  char *local_170;
  int local_14c;
  uint local_13c;
  uint local_12c;
  long local_128 [36];
  uint *local_8;
  
  local_8 = in_RDI;
  memset(local_128,0,0x118);
  printf("=== GRAPH ===\n");
  printf("n_nodes = %d\n",(ulong)*local_8);
  for (local_12c = 0; (int)local_12c < (int)*local_8; local_12c = local_12c + 1) {
    lVar5 = *(long *)(local_8 + (long)(int)local_12c * 2 + 8);
    local_128[*(uint *)(lVar5 + 0x38)] =
         *(long *)(lVar5 + 0x88) + local_128[*(uint *)(lVar5 + 0x38)];
    uVar1 = *(uint *)(lVar5 + 8);
    uVar2 = *(uint *)(lVar5 + 0xc);
    uVar3 = *(uint *)(lVar5 + 0x10);
    pcVar6 = GGML_OP_LABEL[*(uint *)(lVar5 + 0x38)];
    if ((*(byte *)(lVar5 + 0x3c) & 1) == 0) {
      local_170 = " ";
      if (*(long *)(lVar5 + 0x40) != 0) {
        local_170 = "g";
      }
    }
    else {
      local_170 = "x";
    }
    uVar4 = *(undefined4 *)(lVar5 + 0x7c);
    lVar7 = *(long *)(lVar5 + 0x80);
    iVar9 = ggml_cycles_per_ms();
    lVar8 = *(long *)(lVar5 + 0x80);
    iVar10 = ggml_cycles_per_ms();
    printf(" - %3d: [ %6d, %6d, %6d] %16s %s (%3d) cpu = %7.3f / %7.3f ms, wall = %7.3f / %7.3f ms\n"
           ,(double)lVar7 / (double)iVar9,
           ((double)lVar8 / (double)iVar10) / (double)*(int *)(lVar5 + 0x7c),
           (double)*(long *)(lVar5 + 0x88) / 1000.0,
           ((double)*(long *)(lVar5 + 0x88) / 1000.0) / (double)*(int *)(lVar5 + 0x7c),
           (ulong)local_12c,(ulong)uVar1,(ulong)uVar2,(ulong)uVar3,pcVar6,local_170,uVar4);
  }
  printf("n_leafs = %d\n",(ulong)local_8[1]);
  for (local_13c = 0; (int)local_13c < (int)local_8[1]; local_13c = local_13c + 1) {
    lVar5 = *(long *)(local_8 + (long)(int)local_13c * 2 + 0x4008);
    printf(" - %3d: [ %6d, %6d] %8s\n",(ulong)local_13c,(ulong)*(uint *)(lVar5 + 8),
           (ulong)*(uint *)(lVar5 + 0xc),GGML_OP_LABEL[*(uint *)(lVar5 + 0x38)]);
  }
  for (local_14c = 0; local_14c < 0x23; local_14c = local_14c + 1) {
    printf("perf_total_per_op_us[%16s] = %7.3f ms\n",(double)local_128[local_14c] / 1000.0,
           GGML_OP_LABEL[local_14c]);
  }
  printf("========================================\n");
  return;
}

Assistant:

void ggml_graph_print(const struct ggml_cgraph * cgraph) {
    int64_t perf_total_per_op_us[GGML_OP_COUNT] = {0};

    GGML_PRINT("=== GRAPH ===\n");

    GGML_PRINT_DEBUG("n_threads       = %d\n",       cgraph->n_threads);
    GGML_PRINT_DEBUG("total work size = %zu bytes\n",cgraph->work_size);

    GGML_PRINT("n_nodes = %d\n", cgraph->n_nodes);
    for (int i = 0; i < cgraph->n_nodes; i++) {
        struct ggml_tensor * node = cgraph->nodes[i];

        perf_total_per_op_us[node->op] += node->perf_time_us;

        GGML_PRINT(" - %3d: [ %6d, %6d, %6d] %16s %s (%3d) cpu = %7.3f / %7.3f ms, wall = %7.3f / %7.3f ms\n",
                i,
                node->ne[0], node->ne[1], node->ne[2],
                GGML_OP_LABEL[node->op], node->is_param ? "x" : node->grad ? "g" : " ", node->perf_runs,
                (double) node->perf_cycles  / (double) ggml_cycles_per_ms(),
                (double) node->perf_cycles  / (double) ggml_cycles_per_ms() / (double) node->perf_runs,
                (double) node->perf_time_us / 1000.0,
                (double) node->perf_time_us / 1000.0 / node->perf_runs);
    }

    GGML_PRINT("n_leafs = %d\n", cgraph->n_leafs);
    for (int i = 0; i < cgraph->n_leafs; i++) {
        struct ggml_tensor * node = cgraph->leafs[i];

        GGML_PRINT(" - %3d: [ %6d, %6d] %8s\n",
                i,
                node->ne[0], node->ne[1],
                GGML_OP_LABEL[node->op]);
    }

    for (int i = 0; i < GGML_OP_COUNT; i++) {
        GGML_PRINT("perf_total_per_op_us[%16s] = %7.3f ms\n", GGML_OP_LABEL[i], (double) perf_total_per_op_us[i] / 1000.0);
    }

    GGML_PRINT("========================================\n");
}